

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O2

parser_error parse_player_timed_effect_msg(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *s2;
  char *pcVar3;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    if (*(long *)((long)pvVar2 + 8) == 0) {
      pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      pcVar3 = *(char **)(*(long *)((long)pvVar2 + 8) + 0x30);
      s2 = parser_getstr(p,"text");
      pcVar3 = string_append(pcVar3,s2);
      *(char **)(*(long *)((long)pvVar2 + 8) + 0x30) = pcVar3;
      pVar1 = PARSE_ERROR_NONE;
    }
    return pVar1;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                ,0x22b,"enum parser_error parse_player_timed_effect_msg(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_effect_msg(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);

	assert(ps);
	if (!ps->e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	ps->e->msg = string_append(ps->e->msg, parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}